

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_6d004::StatTask::inputsAvailable(StatTask *this,TaskInterface ti)

{
  StatNode *this_00;
  BuildEngineDelegate *pBVar1;
  FileInfo info;
  TaskInterface local_118;
  ValueType local_108;
  uint8_t auStack_f0 [8];
  ValueType local_e8;
  undefined1 local_d0 [56];
  pointer puStack_98;
  pointer local_90;
  uint8_t auStack_88 [8];
  BuildValue local_80;
  
  local_118.ctx = ti.ctx;
  local_118.impl = ti.impl;
  this_00 = this->statnode;
  local_80.kind = (Kind)ti.impl;
  local_80.numOutputInfos = ti.impl._4_4_;
  local_80.signature.value._0_4_ = ti.ctx._0_4_;
  local_80.signature.value._4_4_ = ti.ctx._4_4_;
  pBVar1 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_80);
  llbuild::buildsystem::StatNode::getFileInfo
            ((FileInfo *)local_d0,this_00,(FileSystem *)pBVar1[1]._vptr_BuildEngineDelegate[2]);
  if ((((local_d0._16_8_ == 0 && local_d0._24_8_ == 0) &&
       (local_d0._0_8_ == 0 && local_d0._8_8_ == 0)) && local_d0._32_8_ == 0) &&
     (local_d0._40_8_ == 0)) {
    local_80.kind = MissingInput;
    local_80.numOutputInfos = 0;
    local_80.signature.value._0_4_ = 0;
    local_80.signature.value._4_4_ = 0;
    local_80.valueData.asOutputInfo.device._0_4_ = 0;
    local_80.valueData.asOutputInfo.device._4_4_ = 0;
    local_80.valueData.asOutputInfo.inode._0_4_ = 0;
    local_80.valueData.asOutputInfo.inode._4_4_ = 0;
    local_80.valueData.asOutputInfo.mode._0_4_ = 0;
    local_80.valueData.asOutputInfo.mode._4_4_ = 0;
    local_80.valueData.asOutputInfo.size._0_4_ = 0;
    local_80.valueData.asOutputInfo.size._4_4_ = 0;
    local_80.valueData.asOutputInfo.modTime.seconds._0_4_ = 0;
    local_80.valueData.asOutputInfo.modTime.seconds._4_4_ = 0;
    local_80.valueData.asOutputInfo.modTime.nanoseconds._0_4_ = 0;
    local_80.valueData.asOutputInfo.modTime.nanoseconds._4_4_ = 0;
    local_80.valueData._48_4_ = 0;
    local_80.valueData._52_4_ = 0;
    local_80.valueData._56_4_ = 0;
    local_80.valueData._60_4_ = 0;
    local_80.valueData._64_4_ = 0;
    local_80.valueData._68_4_ = 0;
    local_80.valueData._72_4_ = 0;
    local_80.valueData._76_4_ = 0;
    local_80.stringValues.contents._0_4_ = 0;
    local_80.stringValues.contents._4_4_ = 0;
    local_80.stringValues.size = 0;
    llbuild::buildsystem::BuildValue::toData(&local_108,&local_80);
    llbuild::core::TaskInterface::complete(&local_118,&local_108,false);
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_90;
    auStack_f0[0] = auStack_88[0];
    auStack_f0[1] = auStack_88[1];
    auStack_f0[2] = auStack_88[2];
    auStack_f0[3] = auStack_88[3];
    auStack_f0[4] = auStack_88[4];
    auStack_f0[5] = auStack_88[5];
    auStack_f0[6] = auStack_88[6];
    auStack_f0[7] = auStack_88[7];
    local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_d0._48_8_;
    local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_98;
    local_80.kind = ExistingInput;
    local_80.numOutputInfos = 1;
    local_80.signature.value._0_4_ = 0;
    local_80.signature.value._4_4_ = 0;
    local_80.stringValues.contents._0_4_ = 0;
    local_80.stringValues.contents._4_4_ = 0;
    local_80.stringValues.size = 0;
    local_80.valueData.asOutputInfo.device._0_4_ = (undefined4)local_d0._0_8_;
    local_80.valueData.asOutputInfo.device._4_4_ = SUB84(local_d0._0_8_,4);
    local_80.valueData.asOutputInfo.inode._0_4_ = (undefined4)local_d0._8_8_;
    local_80.valueData.asOutputInfo.inode._4_4_ = SUB84(local_d0._8_8_,4);
    local_80.valueData.asOutputInfo.mode._0_4_ = (undefined4)local_d0._16_8_;
    local_80.valueData.asOutputInfo.mode._4_4_ = SUB84(local_d0._16_8_,4);
    local_80.valueData.asOutputInfo.size._0_4_ = (undefined4)local_d0._24_8_;
    local_80.valueData.asOutputInfo.size._4_4_ = SUB84(local_d0._24_8_,4);
    local_80.valueData.asOutputInfo.modTime.seconds._0_4_ = (undefined4)local_d0._32_8_;
    local_80.valueData.asOutputInfo.modTime.seconds._4_4_ = SUB84(local_d0._32_8_,4);
    local_80.valueData.asOutputInfo.modTime.nanoseconds._0_4_ = (undefined4)local_d0._40_8_;
    local_80.valueData.asOutputInfo.modTime.nanoseconds._4_4_ = SUB84(local_d0._40_8_,4);
    local_80.valueData._64_4_ = SUB84(local_90,0);
    local_80.valueData._68_4_ = (undefined4)((ulong)local_90 >> 0x20);
    local_80.valueData._72_4_ = auStack_88._0_4_;
    local_80.valueData._76_4_ = auStack_88._4_4_;
    local_80.valueData._48_4_ = (undefined4)local_d0._48_8_;
    local_80.valueData._52_4_ = SUB84(local_d0._48_8_,4);
    local_80.valueData._56_4_ = SUB84(puStack_98,0);
    local_80.valueData._60_4_ = (undefined4)((ulong)puStack_98 >> 0x20);
    llbuild::buildsystem::BuildValue::toData(&local_e8,&local_80);
    llbuild::core::TaskInterface::complete(&local_118,&local_e8,false);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_80);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // FIXME: We should do this work in the background.

    // Get the information on the file.
    auto info = statnode.getFileInfo(getBuildSystem(ti).getFileSystem());
    if (info.isMissing()) {
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    ti.complete(BuildValue::makeExistingInput(info).toData());
  }